

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

bool google::protobuf::util::anon_unknown_4::WithinFractionOrMargin<float>
               (float x,float y,float fraction,float margin)

{
  bool bVar1;
  LogMessage *pLVar2;
  float *pfVar3;
  double dVar4;
  float local_50;
  float local_4c;
  float local_48;
  byte local_41;
  float relative_margin;
  char *local_38;
  LogMessageFatal local_30 [19];
  Voidify local_1d;
  float local_1c;
  float local_18;
  float margin_local;
  float fraction_local;
  float y_local;
  float x_local;
  
  local_41 = 0;
  bVar1 = false;
  if ((0.0 <= fraction) && (bVar1 = false, fraction < 1.0)) {
    bVar1 = 0.0 <= margin;
  }
  local_1c = margin;
  local_18 = fraction;
  margin_local = y;
  fraction_local = x;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&relative_margin,
               "fraction >= T(0) && fraction < T(1) && margin >= T(0)");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/field_comparator.cc"
               ,0x2d,_relative_margin,local_38);
    local_41 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_1d,pLVar2);
  }
  if ((local_41 & 1) == 0) {
    bVar1 = std::isfinite(fraction_local);
    if ((bVar1) && (bVar1 = std::isfinite(margin_local), local_48 = local_18, bVar1)) {
      dVar4 = std::fabs((double)(ulong)(uint)fraction_local);
      local_4c = SUB84(dVar4,0);
      dVar4 = std::fabs((double)(ulong)(uint)margin_local);
      local_50 = SUB84(dVar4,0);
      pfVar3 = std::max<float>(&local_4c,&local_50);
      local_48 = local_48 * *pfVar3;
      dVar4 = std::fabs((double)(ulong)(uint)(fraction_local - margin_local));
      pfVar3 = std::max<float>(&local_1c,&local_48);
      y_local._3_1_ = SUB84(dVar4,0) <= *pfVar3;
    }
    else {
      y_local._3_1_ = false;
    }
    return y_local._3_1_;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

bool WithinFractionOrMargin(const T x, const T y, const T fraction,
                            const T margin) {
  ABSL_DCHECK(fraction >= T(0) && fraction < T(1) && margin >= T(0));

  if (!std::isfinite(x) || !std::isfinite(y)) {
    return false;
  }
  const T relative_margin = fraction * std::max(std::fabs(x), std::fabs(y));
  return std::fabs(x - y) <= std::max(margin, relative_margin);
}